

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaAllocator_T::CalculateStatistics(VmaAllocator_T *this,VmaTotalStatistics *pStats)

{
  uint32_t uVar1;
  VmaAllocator_T *in_RDI;
  uint32_t memHeapIndex_1;
  uint32_t memHeapIndex;
  uint32_t memTypeIndex_3;
  uint32_t memTypeIndex_2;
  uint32_t memTypeIndex_1;
  VmaBlockVector *blockVector;
  VmaPool pool;
  VmaMutexLockRead lock;
  VmaBlockVector *pBlockVector;
  uint32_t memTypeIndex;
  uint32_t i_1;
  uint32_t i;
  VmaDetailedStatistics *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ItemType *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar3;
  uint local_58;
  ItemType *local_38;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  VmaClearDetailedStatistics((VmaDetailedStatistics *)0x2ff7a8);
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    VmaClearDetailedStatistics((VmaDetailedStatistics *)0x2ff7d8);
  }
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    VmaClearDetailedStatistics((VmaDetailedStatistics *)0x2ff822);
  }
  local_1c = 0;
  while( true ) {
    uVar1 = GetMemoryTypeCount(in_RDI);
    if (uVar1 <= local_1c) break;
    if (in_RDI->m_pBlockVectors[local_1c] != (VmaBlockVector *)0x0) {
      VmaBlockVector::AddDetailedStatistics
                ((VmaBlockVector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (VmaDetailedStatistics *)
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    local_1c = local_1c + 1;
  }
  VmaMutexLockRead::VmaMutexLockRead
            ((VmaMutexLockRead *)in_stack_ffffffffffffff70,
             (VmaRWMutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             SUB41((uint)in_stack_ffffffffffffff64 >> 0x18,0));
  local_38 = VmaIntrusiveLinkedList<VmaPoolListItemTraits>::Front(&in_RDI->m_Pools);
  while (local_38 != (ItemType *)0x0) {
    VmaBlockVector::GetMemoryTypeIndex(&local_38->m_BlockVector);
    VmaBlockVector::AddDetailedStatistics
              ((VmaBlockVector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (VmaDetailedStatistics *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    VmaDedicatedAllocationList::AddDetailedStatistics
              ((VmaDedicatedAllocationList *)in_stack_ffffffffffffff70,
               (VmaDetailedStatistics *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    in_stack_ffffffffffffff70 =
         VmaIntrusiveLinkedList<VmaPoolListItemTraits>::GetNext((ItemType *)0x2ff97e);
    local_38 = in_stack_ffffffffffffff70;
  }
  VmaMutexLockRead::~VmaMutexLockRead
            ((VmaMutexLockRead *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_58 = 0;
  while( true ) {
    uVar3 = local_58;
    uVar1 = GetMemoryTypeCount(in_RDI);
    if (uVar1 <= uVar3) break;
    VmaDedicatedAllocationList::AddDetailedStatistics
              ((VmaDedicatedAllocationList *)in_stack_ffffffffffffff70,
               (VmaDetailedStatistics *)CONCAT44(uVar3,in_stack_ffffffffffffff68));
    local_58 = local_58 + 1;
  }
  uVar3 = 0;
  while( true ) {
    uVar2 = uVar3;
    uVar1 = GetMemoryTypeCount(in_RDI);
    if (uVar1 <= uVar3) break;
    VmaAddDetailedStatistics
              ((VmaDetailedStatistics *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    uVar3 = uVar2 + 1;
  }
  uVar3 = 0;
  while( true ) {
    uVar2 = uVar3;
    uVar1 = GetMemoryHeapCount(in_RDI);
    if (uVar1 <= uVar3) break;
    VmaAddDetailedStatistics
              ((VmaDetailedStatistics *)CONCAT44(uVar3,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    uVar3 = uVar2 + 1;
  }
  return;
}

Assistant:

void VmaAllocator_T::CalculateStatistics(VmaTotalStatistics* pStats)
{
    // Initialize.
    VmaClearDetailedStatistics(pStats->total);
    for(uint32_t i = 0; i < VK_MAX_MEMORY_TYPES; ++i)
        VmaClearDetailedStatistics(pStats->memoryType[i]);
    for(uint32_t i = 0; i < VK_MAX_MEMORY_HEAPS; ++i)
        VmaClearDetailedStatistics(pStats->memoryHeap[i]);

    // Process default pools.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        VmaBlockVector* const pBlockVector = m_pBlockVectors[memTypeIndex];
        if (pBlockVector != VMA_NULL)
            pBlockVector->AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
    }

    // Process custom pools.
    {
        VmaMutexLockRead lock(m_PoolsMutex, m_UseMutex);
        for(VmaPool pool = m_Pools.Front(); pool != VMA_NULL; pool = m_Pools.GetNext(pool))
        {
            VmaBlockVector& blockVector = pool->m_BlockVector;
            const uint32_t memTypeIndex = blockVector.GetMemoryTypeIndex();
            blockVector.AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
            pool->m_DedicatedAllocations.AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
        }
    }

    // Process dedicated allocations.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        m_DedicatedAllocations[memTypeIndex].AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
    }

    // Sum from memory types to memory heaps.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        const uint32_t memHeapIndex = m_MemProps.memoryTypes[memTypeIndex].heapIndex;
        VmaAddDetailedStatistics(pStats->memoryHeap[memHeapIndex], pStats->memoryType[memTypeIndex]);
    }

    // Sum from memory heaps to total.
    for(uint32_t memHeapIndex = 0; memHeapIndex < GetMemoryHeapCount(); ++memHeapIndex)
        VmaAddDetailedStatistics(pStats->total, pStats->memoryHeap[memHeapIndex]);

    VMA_ASSERT(pStats->total.statistics.allocationCount == 0 ||
        pStats->total.allocationSizeMax >= pStats->total.allocationSizeMin);
    VMA_ASSERT(pStats->total.unusedRangeCount == 0 ||
        pStats->total.unusedRangeSizeMax >= pStats->total.unusedRangeSizeMin);
}